

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.hpp
# Opt level: O0

void __thiscall
fmt::impl::counting_ostream<char,std::char_traits<char>>::~counting_ostream
          (counting_ostream<char,std::char_traits<char>> *this)

{
  counting_ostream<char,_std::char_traits<char>_>::~counting_ostream
            ((counting_ostream<char,_std::char_traits<char>_> *)
             (this + *(long *)(*(long *)this + -0x18)));
  return;
}

Assistant:

counting_ostream(std::basic_ostream<CharT, Traits>& out) :
	    Base(&sbuf), sbuf(*(out.rdbuf())) {
	 /* inherit locale from our base stream */
	 this->imbue(out.getloc());
      }